

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<15>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<15> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  Base::Base(&this->super_Base,head,MAT,0xf);
  readSequence<njoy::ENDFtk::section::Type<15>::PartialDistribution,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->partials_,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0xf,
             (head->super_StructureDivision).tail.fields._M_elems[2],
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(head->super_StructureDivision).base.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl,
             (int)&this->partials_);
  verifyNK((int)((ulong)((long)(this->partials_).
                               super__Vector_base<njoy::ENDFtk::section::Type<15>::PartialDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::PartialDistribution>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->partials_).
                              super__Vector_base<njoy::ENDFtk::section::Type<15>::PartialDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::PartialDistribution>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x3e0f83e1);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,0xf);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try:
    Base( head, MAT, 15 ),
    partials_( readSequence< PartialDistribution >(
                   begin, end, lineNumber,
                   MAT, 15, head.MT(), head.N1() ) ) {
    verifyNK( this->NK() );
    readSEND( begin, end, lineNumber, MAT, 15 );
  } catch( std::exception& e ) {
    Log::info( "Trouble while reading section {} of File 15 of Material {}",
               head.MT(), MAT );
    throw e;
  }